

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_submit.c
# Opt level: O0

int32_t nghttp2_submit_push_promise
                  (nghttp2_session *session,uint8_t flags,int32_t stream_id,nghttp2_nv *nva,
                  size_t nvlen,void *promised_stream_user_data)

{
  int iVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  nghttp2_mem *mem_00;
  nghttp2_mem *mem;
  int rv;
  int32_t promised_stream_id;
  uint8_t flags_copy;
  nghttp2_nv *nva_copy;
  nghttp2_frame *frame;
  nghttp2_outbound_item *item;
  void *promised_stream_user_data_local;
  size_t nvlen_local;
  nghttp2_nv *nva_local;
  int32_t stream_id_local;
  uint8_t flags_local;
  nghttp2_session *session_local;
  
  mem_00 = &session->mem;
  if ((stream_id < 1) ||
     (item = (nghttp2_outbound_item *)promised_stream_user_data,
     promised_stream_user_data_local = (void *)nvlen, nvlen_local = (size_t)nva,
     nva_local._0_4_ = stream_id, nva_local._7_1_ = flags, _stream_id_local = session,
     iVar1 = nghttp2_session_is_my_stream_id(session,stream_id), iVar1 != 0)) {
    session_local._4_4_ = 0xfffffe0b;
  }
  else if (_stream_id_local->server == '\0') {
    session_local._4_4_ = 0xfffffe07;
  }
  else if (_stream_id_local->next_stream_id < 0x80000000) {
    frame = (nghttp2_frame *)nghttp2_mem_malloc(mem_00,0x98);
    if (frame == (nghttp2_frame *)0x0) {
      session_local._4_4_ = 0xfffffc7b;
    }
    else {
      nghttp2_outbound_item_init((nghttp2_outbound_item *)&frame->hd);
      *(nghttp2_outbound_item **)((long)frame + 0x70) = item;
      nva_copy = (nghttp2_nv *)&frame->hd;
      uVar2 = nghttp2_nv_array_copy
                        ((nghttp2_nv **)&promised_stream_id,(nghttp2_nv *)nvlen_local,
                         (size_t)promised_stream_user_data_local,mem_00);
      if ((int)uVar2 < 0) {
        nghttp2_mem_free(mem_00,frame);
        session_local._4_4_ = uVar2;
      }
      else {
        uVar2 = _stream_id_local->next_stream_id;
        _stream_id_local->next_stream_id = _stream_id_local->next_stream_id + 2;
        nghttp2_frame_push_promise_init
                  ((nghttp2_push_promise *)nva_copy,'\x04',(int32_t)nva_local,uVar2,
                   _promised_stream_id,(size_t)promised_stream_user_data_local);
        uVar3 = nghttp2_session_add_item(_stream_id_local,(nghttp2_outbound_item *)&frame->hd);
        session_local._4_4_ = uVar2;
        if (uVar3 != 0) {
          nghttp2_frame_push_promise_free((nghttp2_push_promise *)nva_copy,mem_00);
          nghttp2_mem_free(mem_00,frame);
          session_local._4_4_ = uVar3;
        }
      }
    }
  }
  else {
    session_local._4_4_ = 0xfffffe03;
  }
  return session_local._4_4_;
}

Assistant:

int32_t nghttp2_submit_push_promise(nghttp2_session *session, uint8_t flags,
                                    int32_t stream_id, const nghttp2_nv *nva,
                                    size_t nvlen,
                                    void *promised_stream_user_data) {
  nghttp2_outbound_item *item;
  nghttp2_frame *frame;
  nghttp2_nv *nva_copy;
  uint8_t flags_copy;
  int32_t promised_stream_id;
  int rv;
  nghttp2_mem *mem;
  (void)flags;

  mem = &session->mem;

  if (stream_id <= 0 || nghttp2_session_is_my_stream_id(session, stream_id)) {
    return NGHTTP2_ERR_INVALID_ARGUMENT;
  }

  if (!session->server) {
    return NGHTTP2_ERR_PROTO;
  }

  /* All 32bit signed stream IDs are spent. */
  if (session->next_stream_id > INT32_MAX) {
    return NGHTTP2_ERR_STREAM_ID_NOT_AVAILABLE;
  }

  item = nghttp2_mem_malloc(mem, sizeof(nghttp2_outbound_item));
  if (item == NULL) {
    return NGHTTP2_ERR_NOMEM;
  }

  nghttp2_outbound_item_init(item);

  item->aux_data.headers.stream_user_data = promised_stream_user_data;

  frame = &item->frame;

  rv = nghttp2_nv_array_copy(&nva_copy, nva, nvlen, mem);
  if (rv < 0) {
    nghttp2_mem_free(mem, item);
    return rv;
  }

  flags_copy = NGHTTP2_FLAG_END_HEADERS;

  promised_stream_id = (int32_t)session->next_stream_id;
  session->next_stream_id += 2;

  nghttp2_frame_push_promise_init(&frame->push_promise, flags_copy, stream_id,
                                  promised_stream_id, nva_copy, nvlen);

  rv = nghttp2_session_add_item(session, item);

  if (rv != 0) {
    nghttp2_frame_push_promise_free(&frame->push_promise, mem);
    nghttp2_mem_free(mem, item);

    return rv;
  }

  return promised_stream_id;
}